

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void geopolyCcwFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  GeoPoly *p;
  long lVar4;
  double dVar5;
  
  p = geopolyFuncParam(context,*argv,(int *)0x0);
  if (p != (GeoPoly *)0x0) {
    dVar5 = geopolyArea(p);
    iVar2 = p->nVertex;
    if (dVar5 < 0.0) {
      lVar3 = (long)iVar2;
      for (lVar4 = 1; lVar4 < lVar3 + -1; lVar4 = lVar4 + 1) {
        uVar1 = *(undefined8 *)(p->a + lVar4 * 2);
        *(undefined8 *)(p->a + lVar4 * 2) = *(undefined8 *)(p->hdr + lVar3 * 8 + -4);
        *(undefined8 *)(p->hdr + lVar3 * 8 + -4) = uVar1;
        lVar3 = lVar3 + -1;
      }
    }
    sqlite3_result_blob(context,p->hdr,iVar2 * 8 + 4,(_func_void_void_ptr *)0xffffffffffffffff);
    sqlite3_free(p);
    return;
  }
  return;
}

Assistant:

static void geopolyCcwFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  GeoPoly *p = geopolyFuncParam(context, argv[0], 0);
  (void)argc;
  if( p ){
    if( geopolyArea(p)<0.0 ){
      int ii, jj;
      for(ii=1, jj=p->nVertex-1; ii<jj; ii++, jj--){
        GeoCoord t = GeoX(p,ii);
        GeoX(p,ii) = GeoX(p,jj);
        GeoX(p,jj) = t;
        t = GeoY(p,ii);
        GeoY(p,ii) = GeoY(p,jj);
        GeoY(p,jj) = t;
      }
    }
    sqlite3_result_blob(context, p->hdr,
       4+8*p->nVertex, SQLITE_TRANSIENT);
    sqlite3_free(p);
  }
}